

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_process_active_single_queue
              (event_base *base,evcallback_list *activeq,int max_to_process,timeval *endtime)

{
  uint8_t uVar1;
  ushort uVar2;
  event *ev;
  long lVar3;
  int iVar4;
  short sVar5;
  uint uVar6;
  short *psVar7;
  _func_void_int_short_void_ptr *p_Var8;
  uint uVar9;
  char *pcVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  char *pcVar11;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar12;
  void *extraout_RDX_05;
  int iVar13;
  event *ev_00;
  __time_t _Var14;
  char *pcVar15;
  timeval *ptVar16;
  int iVar17;
  bool bVar18;
  timeval run_at;
  timeval local_80;
  int local_6c;
  timeval local_68;
  int local_54;
  timeval *local_50;
  timeval *local_48;
  _func_void_int_short_void_ptr *local_40;
  evcallback_list *local_38;
  
  local_54 = max_to_process;
  local_38 = activeq;
  if (activeq == (evcallback_list *)0x0) {
LAB_002da556:
    event_process_active_single_queue_cold_8();
switchD_002da0fb_default:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x6c2,"0","event_process_active_single_queue");
  }
  local_48 = &base->tv_cache;
  iVar17 = 0;
  local_50 = endtime;
LAB_002d9fe1:
  ev = (event *)local_38->tqh_first;
  if (ev == (event *)0x0) goto LAB_002da521;
  uVar2 = (ev->ev_evcallback).evcb_flags;
  if ((char)uVar2 < '\0') {
    if ((uVar2 & 0x40) == 0 && (ev->ev_events & 0x10U) == 0) {
      event_del_nolock_(ev,0);
      pvVar12 = extraout_RDX_02;
    }
    else {
      event_queue_remove_active(base,(event_callback *)ev);
      pvVar12 = extraout_RDX_01;
    }
    ev_00 = ev;
    if (event_debug_logging_mask_ != 0) {
      uVar2 = ev->ev_res;
      pcVar11 = "EV_READ ";
      if ((uVar2 & 2) == 0) {
        pcVar11 = " ";
      }
      pcVar10 = "EV_WRITE ";
      if ((uVar2 & 4) == 0) {
        pcVar10 = " ";
      }
      pcVar15 = "EV_CLOSED ";
      if (-1 < (char)uVar2) {
        pcVar15 = " ";
      }
      event_debugx_("event_process_active: event: %p, %s%s%scall %p",ev,pcVar11,pcVar10,pcVar15,
                    (ev->ev_evcallback).evcb_cb_union.evcb_callback);
      pvVar12 = extraout_RDX_03;
    }
  }
  else {
    event_queue_remove_active(base,(event_callback *)ev);
    pvVar12 = extraout_RDX;
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("event_process_active: event_callback %p, closure %d, call %p",ev,
                    (ulong)(ev->ev_evcallback).evcb_closure,
                    (ev->ev_evcallback).evcb_cb_union.evcb_callback);
      pvVar12 = extraout_RDX_00;
    }
    ev_00 = (event *)0x0;
  }
  iVar17 = iVar17 + (uint)(((ev->ev_evcallback).evcb_flags & 0x10U) == 0);
  base->current_event = (event_callback *)ev;
  base->current_event_waiters = 0;
  uVar1 = (ev->ev_evcallback).evcb_closure;
  switch(uVar1) {
  case '\0':
    if (ev_00 != (event *)0x0) {
      p_Var8 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
      sVar5 = ev_00->ev_res;
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      (*p_Var8)(ev_00->ev_fd,sVar5,(ev_00->ev_evcallback).evcb_arg);
      goto LAB_002da412;
    }
    goto LAB_002da542;
  case '\x01':
    if (ev_00 != (event *)0x0) {
      sVar5 = (ev_00->ev_).ev_signal.ev_ncalls;
      local_80.tv_sec = CONCAT62(local_80.tv_sec._2_6_,sVar5);
      if (sVar5 != 0) {
        (ev_00->ev_).ev_signal.ev_pncalls = (short *)&local_80;
      }
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      do {
        if ((short)local_80.tv_sec == 0) goto LAB_002da412;
        sVar5 = (short)local_80.tv_sec + -1;
        local_80.tv_sec = CONCAT62(local_80.tv_sec._2_6_,sVar5);
        (ev_00->ev_).ev_signal.ev_ncalls = sVar5;
        if (sVar5 == 0) {
          (ev_00->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        (*(ev_00->ev_evcallback).evcb_cb_union.evcb_callback)
                  (ev_00->ev_fd,ev_00->ev_res,(ev_00->ev_evcallback).evcb_arg);
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.lock)(0,base->th_base_lock);
        }
        iVar13 = base->event_break;
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        }
      } while (iVar13 == 0);
      if ((short)local_80.tv_sec != 0) {
        (ev_00->ev_).ev_io.ev_timeout.tv_usec = 0;
      }
      goto LAB_002da412;
    }
    break;
  case '\x02':
    if (ev_00 == (event *)0x0) goto LAB_002da54c;
    if (((ev_00->ev_).ev_io.ev_timeout.tv_sec == 0) && ((ev_00->ev_).ev_io.ev_timeout.tv_usec == 0))
    {
LAB_002da3d6:
      p_Var8 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
      pvVar12 = (ev_00->ev_evcallback).evcb_arg;
      iVar13 = ev_00->ev_fd;
      sVar5 = ev_00->ev_res;
      if (base->th_base_lock != (void *)0x0) {
        local_40 = p_Var8;
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        p_Var8 = local_40;
      }
      (*p_Var8)(iVar13,sVar5,pvVar12);
      goto LAB_002da412;
    }
    if ((ulong)((ev_00->ev_).ev_io.ev_timeout.tv_usec ^ (ev_00->ev_timeout).tv_usec) < 0x100000) {
      ptVar16 = &ev_00->ev_timeout;
      gettime(base,&local_68);
      local_80.tv_usec = (ev_00->ev_timeout).tv_usec;
      if ((((uint)local_80.tv_usec & 0xf0000000) == 0x50000000) &&
         ((int)((uint)((ulong)local_80.tv_usec >> 0x14) & 0xff) < base->n_common_timeouts)) {
        _Var14 = (ev_00->ev_).ev_io.ev_timeout.tv_sec;
        uVar6 = (uint)(ev_00->ev_).ev_io.ev_timeout.tv_usec;
        uVar9 = uVar6 & 0xfff00000;
        psVar7 = (short *)(ulong)(uVar6 & 0xfffff);
        if ((ev_00->ev_res & 1) == 0) {
          ptVar16 = &local_68;
          local_80.tv_usec = local_68.tv_usec;
        }
        else {
          local_80.tv_usec = (__suseconds_t)((uint)local_80.tv_usec & 0xfffff);
        }
      }
      else {
        bVar18 = (ev_00->ev_res & 1) == 0;
        _Var14 = (ev_00->ev_).ev_io.ev_timeout.tv_sec;
        if (bVar18) {
          local_80.tv_usec = local_68.tv_usec;
        }
        psVar7 = (ev_00->ev_).ev_signal.ev_pncalls;
        if (bVar18) {
          ptVar16 = &local_68;
        }
        uVar9 = 0;
      }
      local_80.tv_sec = ptVar16->tv_sec + _Var14;
      local_80.tv_usec = local_80.tv_usec + (long)psVar7;
      if (999999 < local_80.tv_usec) {
        local_80.tv_sec = local_80.tv_sec + 1;
        local_80.tv_usec = local_80.tv_usec - 1000000;
      }
      bVar18 = SBORROW8(local_80.tv_sec,local_68.tv_sec);
      lVar3 = local_80.tv_sec - local_68.tv_sec;
      if (local_80.tv_sec == local_68.tv_sec) {
        bVar18 = SBORROW8(local_80.tv_usec,local_68.tv_usec);
        lVar3 = local_80.tv_usec - local_68.tv_usec;
      }
      if (bVar18 != lVar3 < 0) {
        local_80.tv_sec = local_68.tv_sec + _Var14;
        local_80.tv_usec = (long)psVar7 + local_68.tv_usec;
        if (999999 < local_80.tv_usec) {
          local_80.tv_sec = local_80.tv_sec + 1;
          local_80.tv_usec = local_80.tv_usec - 1000000;
        }
      }
      local_80.tv_usec = local_80.tv_usec | (ulong)uVar9;
      event_add_nolock_(ev_00,&local_80,1);
      goto LAB_002da3d6;
    }
    goto LAB_002da551;
  case '\x03':
    p_Var8 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
LAB_002da228:
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      pvVar12 = extraout_RDX_05;
    }
    (*p_Var8)((int)ev,(short)(ev->ev_evcallback).evcb_arg,pvVar12);
LAB_002da412:
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    base->current_event = (event_callback *)0x0;
    if (base->current_event_waiters != 0) {
      base->current_event_waiters = 0;
      if (base->current_event_cond != (void *)0x0) {
        (*evthread_cond_fns_.signal_condition)(base->current_event_cond,1);
      }
    }
    iVar13 = 1;
    if (base->event_break == 0) {
      iVar4 = iVar17;
      if (iVar17 < local_54) {
        if ((local_50 != (timeval *)0x0) && (iVar17 != 0)) {
          (base->tv_cache).tv_sec = 0;
          if ((base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
            gettime(base,local_48);
          }
          gettime(base,&local_80);
          if (local_80.tv_sec == local_50->tv_sec) {
            if (local_80.tv_usec < local_50->tv_usec) goto LAB_002da4ed;
LAB_002da4db:
            bVar18 = false;
            local_6c = iVar17;
          }
          else {
            if (local_50->tv_sec <= local_80.tv_sec) goto LAB_002da4db;
LAB_002da4ed:
            bVar18 = true;
          }
          iVar4 = local_6c;
          if (!bVar18) goto LAB_002da503;
        }
        iVar13 = (uint)(base->event_continue != 0) << 2;
        iVar4 = local_6c;
      }
    }
    else {
      local_6c = -1;
      iVar4 = local_6c;
    }
LAB_002da503:
    local_6c = iVar4;
    if (iVar13 != 0) {
      if (iVar13 == 4) {
LAB_002da521:
        local_6c = iVar17;
      }
      return local_6c;
    }
    goto LAB_002d9fe1;
  case '\x04':
    p_Var8 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
    base->current_event = (event_callback *)0x0;
    if (((ev->ev_evcallback).evcb_flags & 0x40) != 0) goto LAB_002da228;
    goto LAB_002da547;
  case '\x05':
  case '\x06':
    if (ev_00 == (event *)0x0) {
      event_process_active_single_queue_cold_3();
    }
    else {
      base->current_event = (event_callback *)0x0;
      if (((ev->ev_evcallback).evcb_flags & 0x40) != 0) {
        p_Var8 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
          pvVar12 = extraout_RDX_04;
        }
        (*p_Var8)((int)ev_00,(short)(ev_00->ev_evcallback).evcb_arg,pvVar12);
        event_debug_note_teardown_(ev_00);
        if (uVar1 == '\x06') {
          if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
            free(ev_00);
          }
          else {
            (*mm_free_fn_)(ev_00);
          }
        }
        goto LAB_002da412;
      }
    }
    event_process_active_single_queue_cold_2();
    break;
  default:
    goto switchD_002da0fb_default;
  }
  event_process_active_single_queue_cold_7();
LAB_002da542:
  event_process_active_single_queue_cold_4();
LAB_002da547:
  event_process_active_single_queue_cold_1();
LAB_002da54c:
  event_process_active_single_queue_cold_6();
LAB_002da551:
  event_process_active_single_queue_cold_5();
  goto LAB_002da556;
}

Assistant:

static int
event_process_active_single_queue(struct event_base *base,
    struct evcallback_list *activeq,
    int max_to_process, const struct timeval *endtime)
{
	struct event_callback *evcb;
	int count = 0;

	EVUTIL_ASSERT(activeq != NULL);

	for (evcb = TAILQ_FIRST(activeq); evcb; evcb = TAILQ_FIRST(activeq)) {
		struct event *ev=NULL;
		if (evcb->evcb_flags & EVLIST_INIT) {
			ev = event_callback_to_event(evcb);

			if (ev->ev_events & EV_PERSIST || ev->ev_flags & EVLIST_FINALIZING)
				event_queue_remove_active(base, evcb);
			else
				event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
			event_debug((
			    "event_process_active: event: %p, %s%s%scall %p",
			    ev,
			    ev->ev_res & EV_READ ? "EV_READ " : " ",
			    ev->ev_res & EV_WRITE ? "EV_WRITE " : " ",
			    ev->ev_res & EV_CLOSED ? "EV_CLOSED " : " ",
			    ev->ev_callback));
		} else {
			event_queue_remove_active(base, evcb);
			event_debug(("event_process_active: event_callback %p, "
				"closure %d, call %p",
				evcb, evcb->evcb_closure, evcb->evcb_cb_union.evcb_callback));
		}

		if (!(evcb->evcb_flags & EVLIST_INTERNAL))
			++count;


		base->current_event = evcb;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		base->current_event_waiters = 0;
#endif

		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_SIGNAL:
			EVUTIL_ASSERT(ev != NULL);
			event_signal_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT_PERSIST:
			EVUTIL_ASSERT(ev != NULL);
			event_persist_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT: {
			void (*evcb_callback)(evutil_socket_t, short, void *);
			short res;
			EVUTIL_ASSERT(ev != NULL);
			evcb_callback = *ev->ev_callback;
			res = ev->ev_res;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_callback(ev->ev_fd, res, ev->ev_arg);
		}
		break;
		case EV_CLOSURE_CB_SELF: {
			void (*evcb_selfcb)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_selfcb;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_selfcb(evcb, evcb->evcb_arg);
		}
		break;
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			void (*evcb_evfinalize)(struct event *, void *);
			int evcb_closure = evcb->evcb_closure;
			EVUTIL_ASSERT(ev != NULL);
			base->current_event = NULL;
			evcb_evfinalize = ev->ev_evcallback.evcb_cb_union.evcb_evfinalize;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_evfinalize(ev, ev->ev_arg);
			event_debug_note_teardown_(ev);
			if (evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
		}
		break;
		case EV_CLOSURE_CB_FINALIZE: {
			void (*evcb_cbfinalize)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_cbfinalize;
			base->current_event = NULL;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_cbfinalize(evcb, evcb->evcb_arg);
		}
		break;
		default:
			EVUTIL_ASSERT(0);
		}

		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		base->current_event = NULL;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event_waiters) {
			base->current_event_waiters = 0;
			EVTHREAD_COND_BROADCAST(base->current_event_cond);
		}
#endif

		if (base->event_break)
			return -1;
		if (count >= max_to_process)
			return count;
		if (count && endtime) {
			struct timeval now;
			update_time_cache(base);
			gettime(base, &now);
			if (evutil_timercmp(&now, endtime, >=))
				return count;
		}
		if (base->event_continue)
			break;
	}
	return count;
}